

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

void __thiscall cmCTestBZR::InfoParser::~InfoParser(InfoParser *this)

{
  ~InfoParser(this);
  operator_delete(this,0x1f0);
  return;
}

Assistant:

InfoParser(cmCTestBZR* bzr, const char* prefix):
    BZR(bzr), CheckOutFound(false)
    {
    this->SetLog(&bzr->Log, prefix);
    this->RegexCheckOut.compile("checkout of branch: *([^\t\r\n]+)$");
    this->RegexParent.compile("parent branch: *([^\t\r\n]+)$");
    }